

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

int nng_socket_get_recv_poll_fd(nng_socket id,int *fdp)

{
  int iVar1;
  nni_sock *local_20;
  nni_sock *sock;
  
  iVar1 = nni_sock_find(&local_20,id.id);
  if (iVar1 == 0) {
    iVar1 = nni_sock_get_recv_fd(local_20,fdp);
    nni_sock_rele(local_20);
  }
  return iVar1;
}

Assistant:

int
nng_socket_get_recv_poll_fd(nng_socket id, int *fdp)
{
	int       rv;
	nni_sock *sock;

	if ((rv = nni_sock_find(&sock, id.id)) != 0) {
		return (rv);
	}

	rv = nni_sock_get_recv_fd(sock, fdp);
	nni_sock_rele(sock);
	return (rv);
}